

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<double,_3,_3> *
tcu::operator*(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *mtx,double scalar)

{
  double dVar1;
  double *pdVar2;
  undefined4 local_2c;
  undefined4 local_28;
  int row;
  int col;
  double scalar_local;
  Matrix<double,_3,_3> *mtx_local;
  Matrix<double,_3,_3> *res;
  
  Matrix<double,_3,_3>::Matrix(__return_storage_ptr__);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      pdVar2 = Matrix<double,_3,_3>::operator()(mtx,local_2c,local_28);
      dVar1 = *pdVar2;
      pdVar2 = Matrix<double,_3,_3>::operator()(__return_storage_ptr__,local_2c,local_28);
      *pdVar2 = dVar1 * scalar;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}